

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

uint32_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hash32
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint32_t seed)

{
  XXH32_hash_t XVar1;
  ValueLength len;
  
  len = byteSize(this);
  XVar1 = VELOCYPACK_XXH32(*(void **)this,len,seed);
  return XVar1;
}

Assistant:

inline uint32_t hash32(uint32_t seed = defaultSeed32) const {
    size_t const size = checkOverflow(byteSize());
    return VELOCYPACK_HASH32(start(), size, seed);
  }